

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O0

void __thiscall QtMWidgets::Stepper::setRange(Stepper *this,int min,int max)

{
  int iVar1;
  int iVar2;
  StepperPrivate *pSVar3;
  StepperPrivate *pSVar4;
  int local_34;
  int local_2c;
  int oldValue;
  int max_local;
  int min_local;
  Stepper *this_local;
  
  local_2c = max;
  if (min < max) {
    local_2c = min;
  }
  pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  pSVar3->minimum = local_2c;
  local_34 = max;
  if (max < min) {
    local_34 = min;
  }
  pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  pSVar3->maximum = local_34;
  pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  iVar1 = pSVar3->value;
  pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  pSVar4 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  iVar2 = StepperPrivate::bound(pSVar3,pSVar4->value);
  pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  pSVar3->value = iVar2;
  pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  StepperPrivate::enableButtons(pSVar3);
  pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  if (pSVar3->value != iVar1) {
    pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    valueChanged(this,pSVar3->value);
  }
  return;
}

Assistant:

void
Stepper::setRange( int min, int max )
{
	d->minimum = min < max ? min : max;
	d->maximum = max < min ? min : max;

	const int oldValue = d->value;

	d->value = d->bound( d->value );

	d->enableButtons();

	if( d->value != oldValue )
		emit valueChanged( d->value );
}